

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasIOS13Features(Model *model)

{
  uint32 uVar1;
  Rep *pRVar2;
  StringVector *pSVar3;
  bool bVar4;
  Pipeline *pPVar5;
  long lVar6;
  void **ppvVar7;
  InternalMetadataWithArenaLite *pIVar8;
  long lVar9;
  bool bVar10;
  
  bVar4 = true;
  if (model->isupdatable_ != false) {
    return true;
  }
  uVar1 = model->_oneof_case_[0];
  if ((int)uVar1 < 0x1f5) {
    if ((int)uVar1 < 0xca) {
      if (uVar1 == 200) {
        pPVar5 = ((model->Type_).pipelineclassifier_)->pipeline_;
        if (pPVar5 == (Pipeline *)0x0) {
          pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
        }
        pRVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
        ppvVar7 = pRVar2->elements;
        if (pRVar2 == (Rep *)0x0) {
          ppvVar7 = (void **)0x0;
        }
        lVar6 = (long)(pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar6 != 0) {
          lVar9 = 0;
          do {
            bVar4 = hasIOS13Features(*(Model **)((long)ppvVar7 + lVar9));
            if (bVar4) {
              return bVar4;
            }
            bVar10 = lVar6 * 8 + -8 != lVar9;
            lVar9 = lVar9 + 8;
          } while (bVar10);
          return bVar4;
        }
      }
      else {
        if (uVar1 != 0xc9) goto switchD_004e3d4f_caseD_7d1;
        pPVar5 = ((model->Type_).pipelineclassifier_)->pipeline_;
        if (pPVar5 == (Pipeline *)0x0) {
          pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
        }
        pRVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
        ppvVar7 = pRVar2->elements;
        if (pRVar2 == (Rep *)0x0) {
          ppvVar7 = (void **)0x0;
        }
        lVar6 = (long)(pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar6 != 0) {
          lVar9 = 0;
          do {
            bVar4 = hasIOS13Features(*(Model **)((long)ppvVar7 + lVar9));
            if (bVar4) {
              return bVar4;
            }
            bVar10 = lVar6 * 8 + -8 != lVar9;
            lVar9 = lVar9 + 8;
          } while (bVar10);
          return bVar4;
        }
      }
    }
    else {
      if (uVar1 != 0xca) {
        if (uVar1 == 0x194) {
          return true;
        }
        goto switchD_004e3d4f_caseD_7d1;
      }
      pSVar3 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
      pIVar8 = &pSVar3->_internal_metadata_;
      if (pSVar3 == (StringVector *)0x0) {
        pIVar8 = (InternalMetadataWithArenaLite *)0x0;
      }
      lVar6 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
      if (lVar6 != 0) {
        lVar9 = 0;
        do {
          bVar4 = hasIOS13Features(*(Model **)
                                    ((long)&(pIVar8->
                                            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                            ).ptr_ + lVar9));
          if (bVar4) {
            return bVar4;
          }
          bVar10 = lVar6 * 8 + -8 != lVar9;
          lVar9 = lVar9 + 8;
        } while (bVar10);
        return bVar4;
      }
    }
    bVar4 = false;
  }
  else {
    switch(uVar1) {
    case 2000:
    case 0x7d4:
    case 0x7d5:
      bVar4 = ((model->Type_).supportvectorclassifier_)->
              _numberofsupportvectorsperclass_cached_byte_size_ == 2;
      break;
    case 0x7d1:
    case 0x7d2:
switchD_004e3d4f_caseD_7d1:
      bVar4 = hasIOS13NeuralNetworkFeatures(model);
      return bVar4;
    case 0x7d3:
      break;
    default:
      if ((uVar1 != 0x1f5) && (uVar1 != 0x22c)) goto switchD_004e3d4f_caseD_7d1;
    }
  }
  return bVar4;
}

Assistant:

bool CoreML::hasIOS13Features(const Specification::Model& model) {
    // New IOS13 features:
    // - no constraint on rank for NN inputs
    // - model is marked as updatable
    // - model parameters are specified
    // - model is of type kKNearestNeighborsClassifier
    // - model is of sound analysis preprocessing
    // - model is of type LinkedModel
    // - model is of type TextClassifier with revision == 2
    // - model is of type Gazetteer
    // - model is of type WordEmbedding
    // - (... add others here ...)

    if (model.isupdatable()) {
        return true;
    }

    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kKNearestNeighborsClassifier:
        case Specification::Model::kLinkedModel:
            return true;
        case Specification::Model::kItemSimilarityRecommender:
            return hasItemSimilarityRecommender(model);
        case Specification::Model::kSoundAnalysisPreprocessing:
            return hasSoundAnalysisPreprocessing(model);
        case Specification::Model::kTextClassifier:
            return model.textclassifier().revision() == 2;
        case Specification::Model::kGazetteer:
            return model.gazetteer().revision() == 2;
        case Specification::Model::kWordEmbedding:
            return model.wordembedding().revision() == 2;
        default:
            return hasIOS13NeuralNetworkFeatures(model);
    }
    return false;
}